

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

void __thiscall
IRBuilderAsmJs::BuildHeapBufferReload(IRBuilderAsmJs *this,uint32 offset,bool isFirstLoad)

{
  bool bVar1;
  bool bVar2;
  JITTimeFunctionBody *pJVar3;
  AsmJsJITInfo *this_00;
  RegOpnd *pRVar4;
  RegOpnd *pRVar5;
  IndirOpnd *pIVar6;
  Instr *pIVar7;
  int32 offset_00;
  RegSlot srcRegSlot;
  int32 local_40;
  int32 local_3c;
  RegSlot local_38;
  RegSlot local_34;
  
  pJVar3 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar1 = JITTimeFunctionBody::IsWasmFunction(pJVar3);
  pJVar3 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  this_00 = JITTimeFunctionBody::GetAsmJsInfo(pJVar3);
  bVar2 = AsmJsJITInfo::IsSharedMemory(this_00);
  if (bVar1) {
    if (isFirstLoad) {
      pRVar4 = BuildDstOpnd(this,3,TyVar);
      pRVar5 = BuildSrcOpnd(this,1,TyVar);
      pIVar6 = IR::IndirOpnd::New(pRVar5,0,TyVar,this->m_func,false);
      pIVar7 = IR::Instr::New(Ld_A,&pRVar4->super_Opnd,&pIVar6->super_Opnd,this->m_func);
      AddInstr(this,pIVar7,offset);
      if (bVar2) {
        local_40 = 0x10;
        local_3c = 0x28;
        local_38 = 6;
        offset_00 = 0x20;
        local_34 = 6;
        srcRegSlot = 3;
        goto LAB_004f579a;
      }
    }
    else if (bVar2) {
      local_40 = 0x10;
      local_34 = 6;
      goto LAB_004f59d6;
    }
    pRVar4 = BuildDstOpnd(this,2,TyVar);
    pRVar5 = BuildSrcOpnd(this,3,TyVar);
    pIVar6 = IR::IndirOpnd::New(pRVar5,0x20,TyVar,this->m_func,false);
    pIVar7 = IR::Instr::New(Ld_A,&pRVar4->super_Opnd,&pIVar6->super_Opnd,this->m_func);
    AddInstr(this,pIVar7,offset);
    pJVar3 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    bVar1 = JITTimeFunctionBody::UsesWAsmJsFastVirtualBuffer(pJVar3);
    local_38 = 7;
    pRVar4 = BuildDstOpnd(this,7,TyVar);
    pRVar5 = BuildSrcOpnd(this,2,TyVar);
    pIVar6 = IR::IndirOpnd::New(pRVar5,0x38,TyVar,this->m_func,false);
    local_34 = 2;
    pIVar7 = IR::Instr::New(Ld_A,&pRVar4->super_Opnd,&pIVar6->super_Opnd,this->m_func);
    AddInstr(this,pIVar7,offset);
    local_40 = 0x40;
    if (bVar1 && !isFirstLoad) goto LAB_004f59d6;
  }
  else {
    if (!isFirstLoad) {
      return;
    }
    local_40 = 0x40;
    local_34 = 2;
    local_3c = 0x38;
    local_38 = 7;
    offset_00 = 0;
    srcRegSlot = 1;
LAB_004f579a:
    pRVar4 = BuildDstOpnd(this,2,TyVar);
    pRVar5 = BuildSrcOpnd(this,srcRegSlot,TyVar);
    pIVar6 = IR::IndirOpnd::New(pRVar5,offset_00,TyVar,this->m_func,false);
    pIVar7 = IR::Instr::New(Ld_A,&pRVar4->super_Opnd,&pIVar6->super_Opnd,this->m_func);
    AddInstr(this,pIVar7,offset);
    pRVar4 = BuildDstOpnd(this,local_38,TyVar);
    pRVar5 = BuildSrcOpnd(this,2,TyVar);
    pIVar6 = IR::IndirOpnd::New(pRVar5,local_3c,TyVar,this->m_func,false);
    pIVar7 = IR::Instr::New(Ld_A,&pRVar4->super_Opnd,&pIVar6->super_Opnd,this->m_func);
    AddInstr(this,pIVar7,offset);
  }
  pRVar4 = BuildDstOpnd(this,4,TyVar);
  pRVar5 = BuildSrcOpnd(this,local_38,TyVar);
  pIVar6 = IR::IndirOpnd::New(pRVar5,0,TyVar,this->m_func,false);
  pIVar7 = IR::Instr::New(Ld_A,&pRVar4->super_Opnd,&pIVar6->super_Opnd,this->m_func);
  AddInstr(this,pIVar7,offset);
LAB_004f59d6:
  pRVar4 = BuildDstOpnd(this,5,TyUint32);
  pRVar5 = BuildSrcOpnd(this,local_34,TyUint32);
  pIVar6 = IR::IndirOpnd::New(pRVar5,local_40,TyUint32,this->m_func,false);
  pIVar7 = IR::Instr::New(Ld_A,&pRVar4->super_Opnd,&pIVar6->super_Opnd,this->m_func);
  AddInstr(this,pIVar7,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildHeapBufferReload(uint32 offset, bool isFirstLoad)
{
    enum ShouldReload
    {
        DoReload,
        DontReload
    };
    const auto AddLoadField = [&](AsmJsRegSlots::ConstSlots dst, AsmJsRegSlots::ConstSlots src, int32 fieldOffset, IRType type, ShouldReload shouldReload)
    {
        if (isFirstLoad || shouldReload == DoReload)
        {
            IR::RegOpnd * dstOpnd = BuildDstOpnd(dst, type);
            IR::Opnd * srcOpnd = IR::IndirOpnd::New(BuildSrcOpnd(src, type), fieldOffset, type, m_func);
            IR::Instr * instr = IR::Instr::New(Js::OpCode::Ld_A, dstOpnd, srcOpnd, m_func);
            AddInstr(instr, offset);
        }
    };

#ifdef ENABLE_WASM
    const bool isWasm = m_func->GetJITFunctionBody()->IsWasmFunction();
    const bool isSharedMem = m_func->GetJITFunctionBody()->GetAsmJsInfo()->IsSharedMemory();

    if(isWasm)
    {
        // WebAssembly.Memory only needs to be loaded once as it can't change over the course of the function
        AddLoadField(AsmJsRegSlots::WasmMemoryReg, AsmJsRegSlots::ModuleMemReg, (int32)Js::WebAssemblyModule::GetMemoryOffset(), TyVar, DontReload);

        if (!isSharedMem)
        {
            // ArrayBuffer
            // GrowMemory can change the ArrayBuffer, we have to reload it
            AddLoadField(AsmJsRegSlots::ArrayReg, AsmJsRegSlots::WasmMemoryReg, Js::WebAssemblyMemory::GetOffsetOfArrayBuffer(), TyVar, DoReload);

            // The buffer doesn't change when using Fast Virtual buffer even if we grow the memory
            ShouldReload shouldReloadBufferPointer = m_func->GetJITFunctionBody()->UsesWAsmJsFastVirtualBuffer() ? DontReload : DoReload;

            // ArrayBuffer.bufferContent
            AddLoadField(AsmJsRegSlots::RefCountedBuffer, AsmJsRegSlots::ArrayReg, Js::ArrayBuffer::GetBufferContentsOffset(), TyVar, DoReload);

            // RefCountedBuffer.buffer
            AddLoadField(AsmJsRegSlots::BufferReg, AsmJsRegSlots::RefCountedBuffer, Js::RefCountedBuffer::GetBufferOffset(), TyVar, shouldReloadBufferPointer);
            // ArrayBuffer.length
            AddLoadField(AsmJsRegSlots::LengthReg, AsmJsRegSlots::ArrayReg, Js::ArrayBuffer::GetByteLengthOffset(), TyUint32, DoReload);
        }
        else
        {
            // SharedArrayBuffer
            // SharedArrayBuffer cannot be detached and the buffer cannot change, no need to reload
            AddLoadField(AsmJsRegSlots::ArrayReg, AsmJsRegSlots::WasmMemoryReg, Js::WebAssemblyMemory::GetOffsetOfArrayBuffer(), TyVar, DontReload);
            // SharedArrayBuffer.SharedContents
            AddLoadField(AsmJsRegSlots::SharedContents, AsmJsRegSlots::ArrayReg, Js::SharedArrayBuffer::GetSharedContentsOffset(), TyVar, DontReload);
            // SharedContents.buffer
            AddLoadField(AsmJsRegSlots::BufferReg, AsmJsRegSlots::SharedContents, Js::SharedContents::GetBufferOffset(), TyVar, DontReload);
            // SharedContents.length
            AddLoadField(AsmJsRegSlots::LengthReg, AsmJsRegSlots::SharedContents, Js::SharedContents::GetBufferLengthOffset(), TyUint32, DoReload);
        }
    }
    else
#endif
    {
        // ArrayBuffer
        // The ArrayBuffer can be changed on the environment, if it is detached, we'll throw
        AddLoadField(AsmJsRegSlots::ArrayReg, AsmJsRegSlots::ModuleMemReg, (int32)Js::AsmJsModuleMemory::MemoryTableBeginOffset, TyVar, DontReload);
        // ArrayBuffer.bufferContent
        AddLoadField(AsmJsRegSlots::RefCountedBuffer, AsmJsRegSlots::ArrayReg, Js::ArrayBuffer::GetBufferContentsOffset(), TyVar, DontReload);
        // RefCountedBuffer.buffer
        AddLoadField(AsmJsRegSlots::BufferReg, AsmJsRegSlots::RefCountedBuffer, Js::RefCountedBuffer::GetBufferOffset(), TyVar, DontReload);
        // ArrayBuffer.length
        AddLoadField(AsmJsRegSlots::LengthReg, AsmJsRegSlots::ArrayReg, Js::ArrayBuffer::GetByteLengthOffset(), TyUint32, DontReload);
    }
}